

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cxx
# Opt level: O0

void to_vector(string *s,string *sep,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *l)

{
  undefined8 uVar1;
  ulong uVar2;
  long lVar3;
  string local_c8 [32];
  string local_a8 [55];
  allocator<char> local_71;
  undefined1 local_70 [8];
  string sub_str;
  size_t found;
  undefined1 local_40 [8];
  string _s;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *l_local;
  string *sep_local;
  string *s_local;
  
  _s.field_2._8_8_ = l;
  std::__cxx11::string::string((string *)local_40,(string *)s);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_70,anon_var_dwarf_5017 + 0xc,&local_71);
    std::allocator<char>::~allocator(&local_71);
    sub_str.field_2._8_8_ = std::__cxx11::string::find((string *)s,(ulong)sep);
    while (sub_str.field_2._8_8_ != -1) {
      if (sub_str.field_2._8_8_ != 0) {
        std::__cxx11::string::substr((ulong)local_a8,(ulong)local_40);
        std::__cxx11::string::operator=((string *)local_70,local_a8);
        std::__cxx11::string::~string(local_a8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)_s.field_2._8_8_,(value_type *)local_70);
      }
      uVar1 = sub_str.field_2._8_8_;
      uVar2 = std::__cxx11::string::size();
      if (uVar2 <= (ulong)uVar1) goto LAB_0010b10b;
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)local_c8,(ulong)local_40);
      std::__cxx11::string::operator=((string *)local_40,local_c8);
      std::__cxx11::string::~string(local_c8);
      sub_str.field_2._8_8_ = std::__cxx11::string::find((string *)local_40,(ulong)sep);
    }
    lVar3 = std::__cxx11::string::length();
    if (lVar3 != 0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)_s.field_2._8_8_,(value_type *)local_40);
    }
LAB_0010b10b:
    std::__cxx11::string::~string((string *)local_70);
  }
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void to_vector(
    const std::string &s, const std::string &sep, std::vector<std::string> &l) {
    std::string _s(s);

  if ( _s.empty() ) return;

  size_t found;
  std::string sub_str = "";

  found = s.find(sep);

  while (found != std::string::npos) {
    /*跳过空值，比如abcd,123456,,8909
     * * 按照逗号分隔，会有空值,found=0*/
    if (found > 0) {
      sub_str = _s.substr(0, found);
      l.push_back(sub_str);
    }

    if (found >= _s.size()) return;

    _s = _s.substr(found + sep.size());
    found = _s.find(sep);
  }

  if (_s.length() > 0) l.push_back(_s);
}